

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_create(exr_context_t ctxt,exr_attr_string_t *s,char *d)

{
  exr_result_t eVar1;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  size_t fulllen;
  int32_t len;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  uVar2 = 0;
  if (in_RDX != (exr_attr_string_t *)0x0) {
    in_stack_ffffffffffffffd0 = strlen((char *)in_RDX);
    if (0x7ffffffe < in_stack_ffffffffffffffd0) {
      if (in_RDI == 0) {
        return 2;
      }
      eVar1 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid string too long for attribute");
      return eVar1;
    }
    uVar2 = (undefined4)in_stack_ffffffffffffffd0;
  }
  eVar1 = exr_attr_string_create_with_length
                    (in_RSI,in_RDX,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                     (int32_t)(in_stack_ffffffffffffffd0 >> 0x20));
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_create (exr_context_t ctxt, exr_attr_string_t* s, const char* d)
{
    int32_t len     = 0;
    if (d)
    {
        size_t  fulllen = strlen (d);
        if (fulllen >= (size_t) INT32_MAX)
        {
            if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        len = (int32_t) fulllen;
    }
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}